

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::addEndpoint(CoreBroker *this,ActionMessage *message)

{
  string_view key;
  bool bVar1;
  uint uVar2;
  pointer pBVar3;
  long in_RSI;
  long *in_RDI;
  ActionMessage add;
  BasicHandleInfo *ept;
  InterfaceType in_stack_00000277;
  ActionMessage *in_stack_00000278;
  CoreBroker *in_stack_00000280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  ActionMessage *this_00;
  ActionMessage *in_stack_fffffffffffffe78;
  ActionMessage *message_00;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffe88;
  CoreBroker *in_stack_fffffffffffffe90;
  GlobalFederateId fedID;
  GlobalFederateId local_144;
  BaseType local_140;
  GlobalFederateId local_13c;
  undefined4 local_138;
  InterfaceType in_stack_fffffffffffffed7;
  undefined4 in_stack_fffffffffffffed8;
  GlobalFederateId in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee4 [12];
  GlobalFederateId in_stack_fffffffffffffef0;
  GlobalFederateId in_stack_fffffffffffffef4;
  string_view in_stack_ffffffffffffff00;
  string_view in_stack_ffffffffffffff10;
  GlobalFederateId local_58;
  undefined4 local_54;
  __sv_type local_50;
  __sv_type local_40;
  string_view local_30;
  undefined4 local_20;
  undefined4 local_1c;
  BasicHandleInfo *local_18;
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = checkInterfaceCreation(in_stack_00000280,in_stack_00000278,in_stack_00000277);
  if (bVar1) {
    local_1c = *(undefined4 *)(local_10 + 8);
    local_20 = *(undefined4 *)(local_10 + 0xc);
    local_30 = ActionMessage::name((ActionMessage *)0x5f0a20);
    ActionMessage::getString_abi_cxx11_
              (in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    local_40 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe70);
    ActionMessage::getString_abi_cxx11_
              (in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    local_50 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe70);
    key._4_12_ = in_stack_fffffffffffffee4;
    key._M_len._0_4_ = in_stack_fffffffffffffee0;
    this_00 = (ActionMessage *)local_40._M_str;
    message_00 = (ActionMessage *)local_50._M_str;
    local_18 = HandleManager::addHandle
                         ((HandleManager *)
                          CONCAT44(in_stack_fffffffffffffedc.gid,in_stack_fffffffffffffed8),
                          in_stack_fffffffffffffef4,(InterfaceHandle)in_stack_fffffffffffffef0.gid,
                          in_stack_fffffffffffffed7,key,in_stack_ffffffffffffff00,
                          in_stack_ffffffffffffff10);
    addLocalInfo(in_stack_fffffffffffffe90,(BasicHandleInfo *)in_stack_fffffffffffffe88,message_00);
    startingAction = (action_t)((ulong)message_00 >> 0x20);
    if ((*(byte *)((long)in_RDI + 0x29c) & 1) == 0) {
      local_54 = 0;
      (**(code **)(*in_RDI + 0x110))(in_RDI,0,local_10);
      if ((((*(byte *)((long)in_RDI + 0x211) & 1) == 0) &&
          ((*(byte *)((long)in_RDI + 0xdd) & 1) == 0)) &&
         ((*(byte *)((long)in_RDI + 0xde) & 1) == 0)) {
        pBVar3 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x5f0b88);
        GlobalFederateId::GlobalFederateId(&local_58,(GlobalBrokerId)(BaseType)in_RDI[3]);
        uVar2 = (*pBVar3->_vptr_BaseTimeCoordinator[4])(pBVar3,(ulong)(uint)local_58.gid);
        if ((uVar2 & 1) != 0) {
          *(undefined1 *)((long)in_RDI + 0x211) = 1;
          GlobalFederateId::GlobalFederateId
                    ((GlobalFederateId *)&stack0xfffffffffffffee4,
                     (GlobalBrokerId)*(BaseType *)((long)in_RDI + 0x14));
          GlobalFederateId::GlobalFederateId
                    ((GlobalFederateId *)&stack0xfffffffffffffedc,
                     (GlobalBrokerId)(BaseType)in_RDI[3]);
          ActionMessage::ActionMessage
                    (in_stack_fffffffffffffe88,startingAction,
                     (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                     (GlobalFederateId)(BaseType)in_stack_fffffffffffffe90);
          setActionFlag<helics::ActionMessage,helics::TimingFlags>
                    ((ActionMessage *)&stack0xfffffffffffffee8,child_flag);
          local_138 = 0;
          (**(code **)(*in_RDI + 0x110))(in_RDI,0,&stack0xfffffffffffffee8);
          pBVar3 = CLI::std::
                   unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                 *)0x5f0c71);
          local_140 = (BaseType)in_RDI[3];
          GlobalFederateId::GlobalFederateId(&local_13c,(GlobalBrokerId)local_140);
          (*pBVar3->_vptr_BaseTimeCoordinator[5])(pBVar3,(ulong)(uint)local_13c.gid);
          fedID.gid = (BaseType)((ulong)pBVar3 >> 0x20);
          pBVar3 = CLI::std::
                   unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                 *)0x5f0cb8);
          GlobalFederateId::GlobalFederateId(&local_144,(GlobalBrokerId)(BaseType)in_RDI[3]);
          BaseTimeCoordinator::setAsParent(pBVar3,fedID);
          ActionMessage::~ActionMessage(this_00);
        }
      }
    }
    else {
      findAndNotifyEndpointTargets
                ((CoreBroker *)add.payload.buffer._M_elems._0_8_,
                 (BasicHandleInfo *)add.Tso.internalTimeCode,(string *)add.Tdemin.internalTimeCode);
    }
  }
  return;
}

Assistant:

void CoreBroker::addEndpoint(ActionMessage& message)
{
    if (!checkInterfaceCreation(message, InterfaceType::ENDPOINT)) {
        return;
    }
    auto& ept = handles.addHandle(message.source_id,
                                  message.source_handle,
                                  InterfaceType::ENDPOINT,
                                  message.name(),
                                  message.getString(typeStringLoc),
                                  message.getString(unitStringLoc));

    addLocalInfo(ept, message);

    if (!isRootc) {
        transmit(parent_route_id, message);
        if (!hasTimeDependency && !globalTime && !asyncTime) {
            if (timeCoord->addDependency(higher_broker_id)) {
                hasTimeDependency = true;
                ActionMessage add(CMD_ADD_INTERDEPENDENCY,
                                  global_broker_id_local,
                                  higher_broker_id);
                setActionFlag(add, child_flag);
                transmit(parent_route_id, add);

                timeCoord->addDependent(higher_broker_id);
                timeCoord->setAsParent(higher_broker_id);
            }
        }
    } else {
        findAndNotifyEndpointTargets(ept, ept.key);
    }
}